

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dump_flags(flags_map_t *f)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  ostream *poVar4;
  ulong local_20;
  size_t j;
  size_t i;
  flags_map_t *f_local;
  
  j = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(f);
    if (sVar1 <= j) break;
    local_20 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](f,j);
      sVar1 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
      if (sVar1 <= local_20) break;
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](f,j);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,local_20);
      if (*pvVar3 == 0) {
        std::operator<<((ostream *)&std::cerr,". ");
      }
      else {
        pvVar2 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](f,j);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,local_20);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*pvVar3);
        std::operator<<(poVar4," ");
      }
      local_20 = local_20 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
    j = j + 1;
  }
  return;
}

Assistant:

void dump_flags(const flags_map_t& f)
{
    for (size_t i = 0; i < f.size(); i++)
    {
        for (size_t j = 0; j < f[i].size(); j++)
        {
            if (0 == f[i][j])
            {
                std::cerr << ". ";
            } else
            {
                std::cerr << f[i][j] << " ";
            }
        }
        std::cerr << std::endl;
    }
}